

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64compiler.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::a64::Compiler::onAttach(Compiler *this,CodeHolder *code)

{
  Error EVar1;
  ulong extraout_RAX;
  Error local_1c;
  
  EVar1 = BaseCompiler::onAttach(&this->super_BaseCompiler,code);
  if ((EVar1 == 0) && (onAttach(), EVar1 = local_1c, (extraout_RAX & 1) != 0)) {
    (this->super_BaseCompiler).super_BaseBuilder.super_BaseEmitter._instructionAlignment = '\x04';
    assignEmitterFuncs((BaseEmitter *)this);
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error Compiler::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));
  Error err = addPassT<ARMRAPass>();

  if (ASMJIT_UNLIKELY(err)) {
    onDetach(code);
    return err;
  }

  _instructionAlignment = uint8_t(4);
  assignEmitterFuncs(this);

  return kErrorOk;
}